

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# storage.hpp
# Opt level: O0

FileRecord * __thiscall diy::FileStorage::extract_file_record(FileStorage *this,int i)

{
  map<int,_diy::FileStorage::FileRecord,_std::less<int>,_std::allocator<std::pair<const_int,_diy::FileStorage::FileRecord>_>_>
  *this_00;
  int in_EDX;
  long in_RSI;
  FileRecord *in_RDI;
  CriticalMapAccessor accessor;
  FileRecord *fr;
  FileRecord *in_stack_ffffffffffffff88;
  FileRecord *in_stack_ffffffffffffff90;
  undefined7 in_stack_ffffffffffffffc8;
  undefined1 uVar1;
  map<int,_diy::FileStorage::FileRecord,_std::less<int>,_std::allocator<std::pair<const_int,_diy::FileStorage::FileRecord>_>_>
  *in_stack_ffffffffffffffd0;
  
  critical_resource<std::map<int,_diy::FileStorage::FileRecord,_std::less<int>,_std::allocator<std::pair<const_int,_diy::FileStorage::FileRecord>_>_>,_tthread::fast_mutex>
  ::access((critical_resource<std::map<int,_diy::FileStorage::FileRecord,_std::less<int>,_std::allocator<std::pair<const_int,_diy::FileStorage::FileRecord>_>_>,_tthread::fast_mutex>
            *)&stack0xffffffffffffffd0,(char *)(in_RSI + 0x20),in_EDX);
  uVar1 = 0;
  resource_accessor<std::map<int,_diy::FileStorage::FileRecord,_std::less<int>,_std::allocator<std::pair<const_int,_diy::FileStorage::FileRecord>_>_>,_tthread::fast_mutex>
  ::operator*((resource_accessor<std::map<int,_diy::FileStorage::FileRecord,_std::less<int>,_std::allocator<std::pair<const_int,_diy::FileStorage::FileRecord>_>_>,_tthread::fast_mutex>
               *)&stack0xffffffffffffffd0);
  std::
  map<int,_diy::FileStorage::FileRecord,_std::less<int>,_std::allocator<std::pair<const_int,_diy::FileStorage::FileRecord>_>_>
  ::operator[](in_stack_ffffffffffffffd0,(key_type *)CONCAT17(uVar1,in_stack_ffffffffffffffc8));
  FileRecord::FileRecord(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  this_00 = resource_accessor<std::map<int,_diy::FileStorage::FileRecord,_std::less<int>,_std::allocator<std::pair<const_int,_diy::FileStorage::FileRecord>_>_>,_tthread::fast_mutex>
            ::operator->((resource_accessor<std::map<int,_diy::FileStorage::FileRecord,_std::less<int>,_std::allocator<std::pair<const_int,_diy::FileStorage::FileRecord>_>_>,_tthread::fast_mutex>
                          *)&stack0xffffffffffffffd0);
  std::
  map<int,_diy::FileStorage::FileRecord,_std::less<int>,_std::allocator<std::pair<const_int,_diy::FileStorage::FileRecord>_>_>
  ::erase(this_00,(key_type *)in_stack_ffffffffffffff88);
  resource_accessor<std::map<int,_diy::FileStorage::FileRecord,_std::less<int>,_std::allocator<std::pair<const_int,_diy::FileStorage::FileRecord>_>_>,_tthread::fast_mutex>
  ::~resource_accessor
            ((resource_accessor<std::map<int,_diy::FileStorage::FileRecord,_std::less<int>,_std::allocator<std::pair<const_int,_diy::FileStorage::FileRecord>_>_>,_tthread::fast_mutex>
              *)0x124fc9);
  return in_RDI;
}

Assistant:

FileRecord    extract_file_record(int i)
      {
        CriticalMapAccessor accessor = filenames_.access();
        FileRecord fr = (*accessor)[i];
        accessor->erase(i);
        return fr;
      }